

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O2

char * debug_varname(GCproto *pt,BCPos pc,BCReg slot)

{
  byte bVar1;
  uint32_t uVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  char *p;
  byte *local_38;
  
  local_38 = (byte *)(ulong)(pt->varinfo).ptr32;
  if (local_38 == (byte *)0x0) {
LAB_00110e16:
    pcVar3 = (char *)0x0;
  }
  else {
    uVar5 = 0;
    do {
      pcVar3 = (char *)local_38;
      bVar1 = *pcVar3;
      uVar4 = (uint)bVar1;
      local_38 = (byte *)pcVar3;
      if (bVar1 < 7) {
        if (bVar1 == 0) goto LAB_00110e16;
      }
      else {
        do {
          local_38 = local_38 + 1;
        } while (*local_38 != 0);
      }
      local_38 = local_38 + 1;
      uVar2 = lj_buf_ruleb128((char **)&local_38);
      uVar5 = uVar5 + uVar2;
      if (pc < uVar5) goto LAB_00110e16;
      uVar2 = lj_buf_ruleb128((char **)&local_38);
    } while ((uVar2 + uVar5 <= pc) || (bVar6 = slot != 0, slot = slot - 1, bVar6));
    if (bVar1 < 7) {
      pcVar3 = "(for index)";
      while (uVar4 = uVar4 - 1, uVar4 != 0) {
        do {
          bVar1 = *pcVar3;
          pcVar3 = (char *)((byte *)pcVar3 + 1);
        } while (bVar1 != 0);
      }
    }
  }
  return (char *)(byte *)pcVar3;
}

Assistant:

static const char *debug_varname(const GCproto *pt, BCPos pc, BCReg slot)
{
  const char *p = (const char *)proto_varinfo(pt);
  if (p) {
    BCPos lastpc = 0;
    for (;;) {
      const char *name = p;
      uint32_t vn = *(const uint8_t *)p;
      BCPos startpc, endpc;
      if (vn < VARNAME__MAX) {
	if (vn == VARNAME_END) break;  /* End of varinfo. */
      } else {
	do { p++; } while (*(const uint8_t *)p);  /* Skip over variable name. */
      }
      p++;
      lastpc = startpc = lastpc + lj_buf_ruleb128(&p);
      if (startpc > pc) break;
      endpc = startpc + lj_buf_ruleb128(&p);
      if (pc < endpc && slot-- == 0) {
	if (vn < VARNAME__MAX) {
#define VARNAMESTR(name, str)	str "\0"
	  name = VARNAMEDEF(VARNAMESTR);
#undef VARNAMESTR
	  if (--vn) while (*name++ || --vn) ;
	}
	return name;
      }
    }
  }
  return NULL;
}